

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

int __thiscall QWidgetPrivate::init(QWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  WindowFlags *flags;
  undefined4 uVar1;
  QWidget *this_00;
  QWidget *pQVar2;
  byte bVar3;
  uint uVar4;
  QWidgetPrivate *d;
  long lVar5;
  QPalette *pQVar6;
  long *plVar7;
  QEvent *this_01;
  uint uVar8;
  int iVar9;
  uint in_EDX;
  int iVar10;
  long in_FS_OFFSET;
  QWidget *copy;
  QHashDummyValue local_59;
  QWidget *local_58;
  undefined1 *puStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  *(uint *)&this->field_0x30 = *(uint *)&this->field_0x30 | 0x401;
  lVar5 = QMetaObject::cast((QObject *)&QApplication::staticMetaObject);
  if (lVar5 == 0) {
    init((EVP_PKEY_CTX *)&local_58);
    goto LAB_002f58f3;
  }
  if (allWidgets != (QWidgetSet *)0x0) {
    local_58 = this_00;
    QHash<QWidget*,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<QWidget*,QHashDummyValue> *)allWidgets,&local_58,&local_59);
  }
  (this->data).winid = 0;
  (this->data).widget_attributes = 0;
  (this->data).window_flags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
  super_QFlagsStorage<Qt::WindowType>.i = in_EDX;
  *(uint *)&(this->data).field_0x10 = *(uint *)&(this->data).field_0x10 & 0xfff80000 | 0x3000;
  if ((in_EDX >> 9 & 1) != 0) {
    this->field_0x252 = this->field_0x252 | 0x80;
    QWidget::setAttribute(this_00,WA_NativeWindow,true);
  }
  uVar8 = *(uint *)(*(long *)&this_00->field_0x8 + 0x244);
  if ((uVar8 >> 0xc & 1) == 0) {
    *(uint *)(*(long *)&this_00->field_0x8 + 0x244) = uVar8 | 0x1000;
  }
  lVar5 = *(long *)(*(long *)&this->field_0x8 + 8);
  if ((*(long *)(lVar5 + 0x10) == 0) &&
     (((uVar8 = (uint)*(byte *)(*(long *)(*(long *)&this->field_0x8 + 0x20) + 0xc), 0x12 < uVar8 ||
       ((0x4000bU >> (uVar8 & 0x1f) & 1) == 0)) && ((*(uint *)(lVar5 + 0x244) >> 0xc & 1) != 0)))) {
    *(uint *)(lVar5 + 0x244) = *(uint *)(lVar5 + 0x244) & 0xffffefff;
  }
  uVar8 = this_00->data->widget_attributes;
  if ((uVar8 >> 0x10 & 1) == 0) {
    this_00->data->widget_attributes = uVar8 | 0x10000;
  }
  iVar9 = 0x1d;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    iVar9 = 0x1df;
  }
  iVar10 = 99;
  if (ctx == (EVP_PKEY_CTX *)0x0) {
    iVar10 = 0x27f;
  }
  (this->data).crect.x1 = 0;
  (this->data).crect.y1 = 0;
  (this->data).crect.x2.m_i = iVar10;
  (this->data).crect.y2.m_i = iVar9;
  initFocusChain(this);
  if ((char)in_EDX == '\x11') {
    QWidget::create(this_00,0,false,false);
  }
  else {
    flags = &(this->data).window_flags;
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      adjustFlags(flags,this_00);
      resolveLayoutDirection(this);
      pQVar6 = QWidget::palette(this_00);
      plVar7 = (long *)QPalette::brush((ColorGroup)pQVar6,Dark);
      if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
            super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) || (*(int *)(*plVar7 + 4) == 0)) {
        uVar8 = *(uint *)&this->field_0x250;
        uVar4 = 0;
        if ((uVar8 >> 0x11 & 1) != 0) goto LAB_002f57b4;
      }
      else {
        bVar3 = QBrush::isOpaque();
        uVar8 = *(uint *)&this->field_0x250;
        if (((uVar8 >> 0x11 & 1) == 0) == (bool)bVar3) {
          uVar4 = (uint)bVar3 << 0x11;
LAB_002f57b4:
          *(uint *)&this->field_0x250 = uVar8 & 0xfffdffff | uVar4;
          updateIsTranslucent(this);
        }
      }
    }
    else {
      QWidget::setParent(this_00,(QWidget *)ctx,
                         (WindowFlags)
                         (flags->super_QFlagsStorageHelper<Qt::WindowType,_4>).
                         super_QFlagsStorage<Qt::WindowType>.i);
    }
  }
  QFont::QFont((QFont *)&local_58,&(this->data).fnt,&this_00->super_QPaintDevice);
  pQVar2 = *(QWidget **)&(this->data).fnt;
  *(QWidget **)&(this->data).fnt = local_58;
  uVar1 = *(undefined4 *)&(this->data).field_0x40;
  *(undefined4 *)&(this->data).field_0x40 = puStack_50._0_4_;
  puStack_50 = (undefined1 *)CONCAT44(puStack_50._4_4_,uVar1);
  local_58 = pQVar2;
  QFont::~QFont((QFont *)&local_58);
  uVar8 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
  if ((~uVar8 & 0xc) != 0) {
    *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar8 | 0xc;
  }
  if (maxInstances <= instanceCounter) {
    maxInstances = instanceCounter + 1;
  }
  local_58 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  instanceCounter = instanceCounter + 1;
  QEvent::QEvent((QEvent *)&local_58,Create);
  QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_58);
  this_01 = (QEvent *)operator_new(0x10);
  QEvent::QEvent(this_01,PolishRequest);
  QCoreApplication::postEvent(&this_00->super_QObject,this_01,0);
  this->extraPaintEngine = (QPaintEngine *)0x0;
  QEvent::~QEvent((QEvent *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
LAB_002f58f3:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::init(QWidget *parentWidget, Qt::WindowFlags f)
{
    Q_Q(QWidget);
    isWidget = true;
    wasWidget = true;

    Q_ASSERT_X(q != parentWidget, Q_FUNC_INFO, "Cannot parent a QWidget to itself");

    if (Q_UNLIKELY(!qobject_cast<QApplication *>(QCoreApplication::instance())))
        qFatal("QWidget: Cannot create a QWidget without QApplication");

    Q_ASSERT(allWidgets);
    if (allWidgets)
        allWidgets->insert(q);

#if QT_CONFIG(thread)
    if (!parent) {
        Q_ASSERT_X(QThread::isMainThread(), "QWidget",
                   "Widgets must be created in the GUI thread.");
    }
#endif

    data.fstrut_dirty = true;

    data.winid = 0;
    data.widget_attributes = 0;
    data.window_flags = f;
    data.window_state = 0;
    data.focus_policy = 0;
    data.context_menu_policy = Qt::DefaultContextMenu;
    data.window_modality = Qt::NonModal;

    data.sizehint_forced = 0;
    data.is_closing = false;
    data.in_show = 0;
    data.in_set_window_state = 0;
    data.in_destructor = false;

    // Widgets with Qt::MSWindowsOwnDC (typically QGLWidget) must have a window handle.
    if (f & Qt::MSWindowsOwnDC) {
        mustHaveWindowHandle = 1;
        q->setAttribute(Qt::WA_NativeWindow);
    }

    q->setAttribute(Qt::WA_QuitOnClose); // might be cleared in adjustQuitOnCloseAttribute()
    adjustQuitOnCloseAttribute();

    q->setAttribute(Qt::WA_WState_Hidden);

    //give potential windows a bigger "pre-initial" size; create() will give them a new size later
    data.crect = parentWidget ? QRect(0,0,100,30) : QRect(0,0,640,480);
    initFocusChain();

    if ((f & Qt::WindowType_Mask) == Qt::Desktop)
        q->create();
    else if (parentWidget)
        q->setParent(parentWidget, data.window_flags);
    else {
        adjustFlags(data.window_flags, q);
        resolveLayoutDirection();
        // opaque system background?
        const QBrush &background = q->palette().brush(QPalette::Window);
        setOpaque(q->isWindow() && background.style() != Qt::NoBrush && background.isOpaque());
    }
    data.fnt = QFont(data.fnt, q);

    q->setAttribute(Qt::WA_PendingMoveEvent);
    q->setAttribute(Qt::WA_PendingResizeEvent);

    if (++QWidgetPrivate::instanceCounter > QWidgetPrivate::maxInstances)
        QWidgetPrivate::maxInstances = QWidgetPrivate::instanceCounter;

    QEvent e(QEvent::Create);
    QCoreApplication::sendEvent(q, &e);
    QCoreApplication::postEvent(q, new QEvent(QEvent::PolishRequest));

    extraPaintEngine = nullptr;
}